

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

ssize_t __thiscall
trial::protocol::buffer::vector<unsigned_char,_std::allocator<unsigned_char>_>::write
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *this,int __fd,void *__buf,
          size_t __n)

{
  int iVar1;
  undefined4 extraout_var;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  long *plVar2;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,__fd);
  iVar1 = (*(this->super_base<unsigned_char>)._vptr_base[2])(this,*plVar2);
  if ((char)iVar1 != '\0') {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this->buffer,
               *(undefined8 *)
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this->buffer + 8),plVar2[1],
               *plVar2 + plVar2[1]);
    return extraout_RAX;
  }
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

virtual void write(const view_type& view)
    {
        if (grow(view.size()))
        {
            buffer.insert(buffer.end(), view.begin(), view.end());
        }
    }